

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O2

string * common_chat_format_name_abi_cxx11_
                   (string *__return_storage_ptr__,common_chat_format format)

{
  runtime_error *this;
  allocator<char> *__a;
  char *__s;
  allocator<char> local_1e;
  allocator<char> local_1d;
  allocator<char> local_1c;
  allocator<char> local_1b;
  allocator<char> local_1a;
  allocator<char> local_19;
  allocator<char> local_18;
  allocator<char> local_17;
  allocator<char> local_16;
  allocator<char> local_15;
  allocator<char> local_14;
  allocator<char> local_13;
  allocator<char> local_12;
  allocator<char> local_11;
  
  switch(format) {
  case COMMON_CHAT_FORMAT_CONTENT_ONLY:
    __s = "Content-only";
    __a = &local_11;
    break;
  case COMMON_CHAT_FORMAT_GENERIC:
    __s = "Generic";
    __a = &local_12;
    break;
  case COMMON_CHAT_FORMAT_MISTRAL_NEMO:
    __s = "Mistral Nemo";
    __a = &local_13;
    break;
  case COMMON_CHAT_FORMAT_LLAMA_3_X:
    __s = "Llama 3.x";
    __a = &local_14;
    break;
  case COMMON_CHAT_FORMAT_LLAMA_3_X_WITH_BUILTIN_TOOLS:
    __s = "Llama 3.x with builtin tools";
    __a = &local_15;
    break;
  case COMMON_CHAT_FORMAT_DEEPSEEK_R1:
    __s = "DeepSeek R1";
    __a = &local_16;
    break;
  case COMMON_CHAT_FORMAT_DEEPSEEK_R1_EXTRACT_REASONING:
    __s = "DeepSeek R1 (extract reasoning)";
    __a = &local_17;
    break;
  case COMMON_CHAT_FORMAT_FIREFUNCTION_V2:
    __s = "FireFunction v2";
    __a = &local_18;
    break;
  case COMMON_CHAT_FORMAT_FUNCTIONARY_V3_2:
    __s = "Functionary v3.2";
    __a = &local_19;
    break;
  case COMMON_CHAT_FORMAT_FUNCTIONARY_V3_1_LLAMA_3_1:
    __s = "Functionary v3.1 Llama 3.1";
    __a = &local_1a;
    break;
  case COMMON_CHAT_FORMAT_HERMES_2_PRO:
    __s = "Hermes 2 Pro";
    __a = &local_1b;
    break;
  case COMMON_CHAT_FORMAT_HERMES_2_PRO_EXTRACT_REASONING:
    __s = "Hermes 2 Pro (extract reasoning)";
    __a = &local_1c;
    break;
  case COMMON_CHAT_FORMAT_COMMAND_R7B:
    __s = "Command R7B";
    __a = &local_1d;
    break;
  case COMMON_CHAT_FORMAT_COMMAND_R7B_EXTRACT_REASONING:
    __s = "Command R7B (extract reasoning)";
    __a = &local_1e;
    break;
  default:
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Unknown chat format");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string common_chat_format_name(common_chat_format format) {
    switch (format) {
        case COMMON_CHAT_FORMAT_CONTENT_ONLY: return "Content-only";
        case COMMON_CHAT_FORMAT_GENERIC: return "Generic";
        case COMMON_CHAT_FORMAT_MISTRAL_NEMO: return "Mistral Nemo";
        case COMMON_CHAT_FORMAT_LLAMA_3_X: return "Llama 3.x";
        case COMMON_CHAT_FORMAT_LLAMA_3_X_WITH_BUILTIN_TOOLS: return "Llama 3.x with builtin tools";
        case COMMON_CHAT_FORMAT_DEEPSEEK_R1: return "DeepSeek R1";
        case COMMON_CHAT_FORMAT_DEEPSEEK_R1_EXTRACT_REASONING: return "DeepSeek R1 (extract reasoning)";
        case COMMON_CHAT_FORMAT_FIREFUNCTION_V2: return "FireFunction v2";
        case COMMON_CHAT_FORMAT_FUNCTIONARY_V3_2: return "Functionary v3.2";
        case COMMON_CHAT_FORMAT_FUNCTIONARY_V3_1_LLAMA_3_1: return "Functionary v3.1 Llama 3.1";
        case COMMON_CHAT_FORMAT_HERMES_2_PRO: return "Hermes 2 Pro";
        case COMMON_CHAT_FORMAT_HERMES_2_PRO_EXTRACT_REASONING: return "Hermes 2 Pro (extract reasoning)";
        case COMMON_CHAT_FORMAT_COMMAND_R7B: return "Command R7B";
        case COMMON_CHAT_FORMAT_COMMAND_R7B_EXTRACT_REASONING: return "Command R7B (extract reasoning)";
        default:
            throw std::runtime_error("Unknown chat format");
    }
}